

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

void __thiscall TestMustache::testPartialFile(TestMustache *this)

{
  QVariantHash map;
  QString output;
  PartialFileLoader partialLoader;
  QString _template;
  QString path;
  QtVariantContext context;
  Renderer renderer;
  undefined1 auStack_178 [8];
  QVariant local_170;
  PartialFileLoader local_150;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QtVariantContext local_e0;
  Renderer local_b8;
  
  QCoreApplication::applicationDirPath();
  QString::QString((QString *)&local_b8,"Jim Smith");
  QString::QString((QString *)&local_150,"jim.smith@gmail.com");
  contactInfo((QString *)auStack_178,(QString *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_150);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  QString::QString((QString *)&local_110,"{{>partial}}");
  Mustache::Renderer::Renderer(&local_b8);
  Mustache::PartialFileLoader::PartialFileLoader(&local_150,(QString *)&local_f8);
  ::QVariant::QVariant(&local_170,(QHash *)auStack_178);
  Mustache::QtVariantContext::QtVariantContext
            (&local_e0,&local_170,&local_150.super_PartialResolver);
  ::QVariant::~QVariant(&local_170);
  Mustache::Renderer::render
            ((QString *)&local_170,&local_b8,(QString *)&local_110,&local_e0.super_Context);
  QString::QString((QString *)&local_128,"Jim Smith -- jim.smith@gmail.com\n");
  QTest::qCompare((QString *)&local_170,(QString *)&local_128,"output",
                  "QString(\"Jim Smith -- jim.smith@gmail.com\\n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_170);
  Mustache::QtVariantContext::~QtVariantContext(&local_e0);
  Mustache::PartialFileLoader::~PartialFileLoader(&local_150);
  Mustache::Renderer::~Renderer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)auStack_178);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  return;
}

Assistant:

void TestMustache::testPartialFile()
{
	QString path = QCoreApplication::applicationDirPath();

	QVariantHash map = contactInfo("Jim Smith", "jim.smith@gmail.com");

	QString _template = "{{>partial}}";

	Mustache::Renderer renderer;
	Mustache::PartialFileLoader partialLoader(path);
	Mustache::QtVariantContext context(map, &partialLoader);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, QString("Jim Smith -- jim.smith@gmail.com\n"));
}